

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_scalar_fe_space.h
# Opt level: O3

void __thiscall
lf::fe::HierarchicScalarFESpace<double>::
HierarchicScalarFESpace<lf::mesh::utils::AllCodimMeshDataSet<unsigned_int>&,void>
          (HierarchicScalarFESpace<double> *this,shared_ptr<const_lf::mesh::Mesh> *mesh_p,
          AllCodimMeshDataSet<unsigned_int> *degree_functor)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  shared_ptr<const_lf::mesh::Mesh> local_40;
  anon_class_8_1_37ba63de local_30;
  
  (this->super_ScalarFESpace<double>)._vptr_ScalarFESpace = (_func_int **)&PTR_Mesh_005166b0;
  (this->mesh_p_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mesh_p->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (mesh_p->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->mesh_p_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  quad::QuadRuleCache::QuadRuleCache(&this->qr_cache_);
  lf::mesh::utils::
  AllCodimMeshDataSet<std::variant<std::monostate,_lf::fe::FePoint<double>,_lf::fe::FeHierarchicSegment<double>,_lf::fe::FeHierarchicTria<double>,_lf::fe::FeHierarchicQuad<double>_>_>
  ::AllCodimMeshDataSet(&this->ref_el_,mesh_p);
  local_40.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mesh_p->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_40.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (mesh_p->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if (local_40.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_40.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_40.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_40.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_30.degree_functor = degree_functor;
  assemble::DynamicFEDofHandler::
  DynamicFEDofHandler<lf::fe::HierarchicScalarFESpace<double>::HierarchicScalarFESpace<lf::mesh::utils::AllCodimMeshDataSet<unsigned_int>&,void>(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::mesh::utils::AllCodimMeshDataSet<unsigned_int>&)::_lambda(lf::mesh::Entity_const&)_1_>
            (&this->dofh_,&local_40,&local_30);
  if (local_40.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  Init<lf::mesh::utils::AllCodimMeshDataSet<unsigned_int>&>(this,degree_functor);
  return;
}

Assistant:

explicit HierarchicScalarFESpace(
      const std::shared_ptr<const lf::mesh::Mesh> &mesh_p, F &&degree_functor)
      : ScalarFESpace<SCALAR>(),
        mesh_p_(mesh_p),
        ref_el_(mesh_p),
        dofh_(mesh_p,
              [&degree_functor](const mesh::Entity &e) -> base::size_type {
                if (e.RefEl() == base::RefEl::kPoint()) {
                  return 1;
                }
                auto degree = degree_functor(e);
                switch (e.RefEl()) {
                  case base::RefEl::kSegment():
                    return degree - 1;
                  case base::RefEl::kTria():
                    return degree <= 2 ? 0 : (degree - 2) * (degree - 1) / 2;
                  case base::RefEl::kQuad():
                    return (degree - 1) * (degree - 1);
                  default:
                    LF_VERIFY_MSG(false, "Something went wrong.");
                }
              }) {
    Init(std::forward<F>(degree_functor));
  }